

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NscDecompiler.cpp
# Opt level: O1

void NscScriptDecompile(CNwnStream *sStream,uchar *pauchData,unsigned_long ulSize,
                       NscCompiler *pCompiler)

{
  byte *__src;
  byte bVar1;
  uint uVar2;
  uint uVar3;
  bool bVar4;
  ushort uVar5;
  ulong uVar6;
  byte *pbVar7;
  byte *pbVar8;
  byte *pbVar9;
  ulong uVar10;
  byte *pbVar11;
  char *pcVar12;
  float fVar13;
  char *pcVar14;
  size_t __n;
  uchar *pStart;
  char szByteText [128];
  char szOpType [32];
  char szOpText [512];
  char szText [1024];
  char local_6e8 [128];
  char local_668 [32];
  NscCompiler *local_648;
  CNwnStream *local_640;
  undefined8 local_638;
  undefined2 local_630;
  char local_438 [1032];
  
  if (8 < (long)ulSize) {
    pbVar7 = pauchData + ulSize;
    pbVar9 = pauchData + 8;
    local_648 = pCompiler;
    local_640 = sStream;
    do {
      pbVar8 = pbVar9 + 1;
      uVar6 = (ulong)*pbVar9;
      pcVar14 = "RSADD";
      pcVar12 = "LOGAND";
      switch(*pbVar9) {
      case 1:
        if (pbVar7 < pbVar9 + 8) goto switchD_001473cb_caseD_2e;
        if (*pbVar8 == 1) {
          uVar3 = *(uint *)(pbVar9 + 2);
          uVar10 = (ulong)(uVar3 >> 0x18 | (uVar3 & 0xff0000) >> 8 | (uVar3 & 0xff00) << 8 |
                          uVar3 << 0x18);
          uVar6 = (ulong)(ushort)(*(ushort *)(pbVar9 + 6) << 8 | *(ushort *)(pbVar9 + 6) >> 8);
          sprintf(local_6e8,"%02X 01 %08X %04X",1,uVar10,uVar6);
          pcVar12 = "CPDOWNSP %08X, %04X";
LAB_00147abf:
          pbVar11 = pbVar9 + 8;
          sprintf((char *)&local_638,pcVar12,uVar10,uVar6);
          goto LAB_00147be0;
        }
        break;
      case 2:
        goto switchD_001473cb_caseD_2;
      case 3:
        if (pbVar7 < pbVar9 + 8) goto switchD_001473cb_caseD_2e;
        if (*pbVar8 == 1) {
          uVar3 = *(uint *)(pbVar9 + 2);
          uVar10 = (ulong)(uVar3 >> 0x18 | (uVar3 & 0xff0000) >> 8 | (uVar3 & 0xff00) << 8 |
                          uVar3 << 0x18);
          uVar6 = (ulong)(ushort)(*(ushort *)(pbVar9 + 6) << 8 | *(ushort *)(pbVar9 + 6) >> 8);
          sprintf(local_6e8,"%02X 01 %08X %04X",3,uVar10,uVar6);
          pcVar12 = "CPTOPSP %08X, %04X";
          goto LAB_00147abf;
        }
        break;
      case 4:
        if (pbVar7 < pbVar9 + 2) goto switchD_001473cb_caseD_2e;
        bVar1 = *pbVar8;
        GetOpText(bVar1,local_668);
        switch(bVar1) {
        case 3:
        case 6:
          pbVar11 = pbVar9 + 6;
          if (pbVar7 < pbVar11) break;
          uVar3 = *(uint *)(pbVar9 + 2);
          uVar10 = (ulong)(uVar3 >> 0x18 | (uVar3 & 0xff0000) >> 8 | (uVar3 & 0xff00) << 8 |
                          uVar3 << 0x18);
          sprintf(local_6e8,"%02X %02X %08X",4,(ulong)bVar1,uVar10);
          sprintf((char *)&local_638,"CONST%s %08X",local_668,uVar10);
          bVar4 = true;
          goto joined_r0x00147cfc;
        case 4:
          pbVar11 = pbVar9 + 6;
          if (pbVar11 <= pbVar7) {
            uVar3 = *(uint *)(pbVar9 + 2);
            fVar13 = (float)(uVar3 >> 0x18 | (uVar3 & 0xff0000) >> 8 | (uVar3 & 0xff00) << 8 |
                            uVar3 << 0x18);
            sprintf(local_6e8,"%02X %02X %08X",4,4,(ulong)(uint)fVar13);
            bVar4 = true;
            sprintf((char *)&local_638,"CONST%s %f",(double)fVar13,local_668);
            goto joined_r0x00147cfc;
          }
          break;
        case 5:
          __src = pbVar9 + 4;
          if (__src <= pbVar7) {
            uVar10 = (ulong)(ushort)(*(ushort *)(pbVar9 + 2) << 8 | *(ushort *)(pbVar9 + 2) >> 8);
            bVar4 = pbVar8 + uVar10 + 3 <= pbVar7;
            pbVar11 = pbVar8;
            if (pbVar8 + uVar10 + 3 <= pbVar7) {
              __n = 0x80;
              if (uVar10 < 0x80) {
                __n = uVar10;
              }
              memmove(local_438,__src,__n);
              local_438[__n] = '\0';
              sprintf(local_6e8,"%02X %02X %04X str",4,5,uVar10);
              snprintf((char *)&local_638,0x200,"CONST%s \"%s\"",local_668,local_438);
              pbVar11 = __src + uVar10;
            }
            goto joined_r0x00147cfc;
          }
        }
        bVar4 = false;
        pbVar11 = pbVar8;
        goto joined_r0x00147cfc;
      case 5:
        pbVar11 = pbVar9 + 5;
        if (pbVar7 < pbVar11) goto switchD_001473cb_caseD_2e;
        if (*pbVar8 == 0) {
          uVar5 = *(ushort *)(pbVar9 + 2) << 8 | *(ushort *)(pbVar9 + 2) >> 8;
          uVar6 = (ulong)uVar5;
          uVar10 = (ulong)pbVar9[4];
          pcVar12 = NscGetActionName((uint)uVar5,local_648);
          sprintf(local_6e8,"%02X 00 %04X %02X",5,uVar6,uVar10);
          pcVar14 = "ACTION %s(%04X), %02X";
          goto LAB_00147e71;
        }
        break;
      case 6:
        goto switchD_001473cb_caseD_6;
      case 7:
        pcVar12 = "LOGOR";
        goto switchD_001473cb_caseD_6;
      case 8:
        pcVar12 = "INCOR";
        goto switchD_001473cb_caseD_6;
      case 9:
        pcVar12 = "EXCOR";
        goto switchD_001473cb_caseD_6;
      case 10:
        pcVar12 = "BOOLAND";
        goto switchD_001473cb_caseD_6;
      case 0xb:
        pcVar12 = "EQUAL";
        goto switchD_001473cb_caseD_6;
      case 0xc:
        pcVar12 = "NEQUAL";
        goto switchD_001473cb_caseD_6;
      case 0xd:
        pcVar12 = "GEQ";
        goto switchD_001473cb_caseD_6;
      case 0xe:
        pcVar12 = "GT";
        goto switchD_001473cb_caseD_6;
      case 0xf:
        pcVar12 = "LT";
        goto switchD_001473cb_caseD_6;
      case 0x10:
        pcVar12 = "LEQ";
        goto switchD_001473cb_caseD_6;
      case 0x11:
        pcVar12 = "SHLEFT";
        goto switchD_001473cb_caseD_6;
      case 0x12:
        pcVar12 = "SHRIGHT";
        goto switchD_001473cb_caseD_6;
      case 0x13:
        pcVar12 = "USHRIGHT";
        goto switchD_001473cb_caseD_6;
      case 0x14:
        pcVar12 = "ADD";
        goto switchD_001473cb_caseD_6;
      case 0x15:
        pcVar12 = "SUB";
        goto switchD_001473cb_caseD_6;
      case 0x16:
        pcVar12 = "MUL";
        goto switchD_001473cb_caseD_6;
      case 0x17:
        pcVar12 = "DIV";
        goto switchD_001473cb_caseD_6;
      case 0x18:
        pcVar12 = "MOD";
switchD_001473cb_caseD_6:
        pbVar11 = pbVar9 + 2;
        if (pbVar7 < pbVar11) {
switchD_001473cb_caseD_2e:
          break;
        }
        bVar1 = *pbVar8;
        GetOpText(bVar1,local_668);
        if (bVar1 == 0x24) {
          if (pbVar7 < pbVar9 + 4) {
            bVar4 = false;
          }
          else {
            uVar10 = (ulong)(ushort)(*(ushort *)(pbVar9 + 2) << 8 | *(ushort *)(pbVar9 + 2) >> 8);
            sprintf(local_6e8,"%02X %02X %04X",uVar6,0x24,uVar10);
            sprintf((char *)&local_638,"%s%s %04X",pcVar12,local_668,uVar10);
            bVar4 = true;
            pbVar11 = pbVar9 + 4;
          }
        }
        else {
          sprintf(local_6e8,"%02X %02X",uVar6,(ulong)bVar1);
          sprintf((char *)&local_638,"%s%s",pcVar12,local_668);
          bVar4 = true;
        }
joined_r0x00147cfc:
        pbVar8 = pbVar11;
        if (!bVar4) break;
        goto LAB_00147be0;
      case 0x19:
        pcVar14 = "NEG";
        goto switchD_001473cb_caseD_2;
      case 0x1a:
        pcVar14 = "COMP";
        goto switchD_001473cb_caseD_2;
      case 0x1b:
        pbVar11 = pbVar9 + 6;
        if (pbVar7 < pbVar11) goto switchD_001473cb_caseD_2e;
        if (*pbVar8 == 0) {
          uVar3 = *(uint *)(pbVar9 + 2);
          pbVar8 = (byte *)(ulong)(uVar3 >> 0x18 | (uVar3 & 0xff0000) >> 8 | (uVar3 & 0xff00) << 8 |
                                  uVar3 << 0x18);
          sprintf(local_6e8,"%02X 00 %08X",0x1b,pbVar8);
          pcVar12 = "MOVSP %08X";
          goto LAB_00147de8;
        }
        break;
      case 0x1c:
        if (pbVar7 < pbVar9 + 2) goto switchD_001473cb_caseD_2e;
        bVar1 = *pbVar8;
        sprintf(local_6e8,"%02X %02X",0x1c,(ulong)bVar1);
        sprintf((char *)&local_638,"SAVE_STATEALL %02x",(ulong)bVar1);
        goto LAB_0014782b;
      case 0x1d:
        if (pbVar7 < pbVar9 + 6) goto switchD_001473cb_caseD_2e;
        if (*pbVar8 == 0) {
          uVar3 = *(uint *)(pbVar9 + 2);
          uVar6 = (ulong)(uVar3 >> 0x18 | (uVar3 & 0xff0000) >> 8 | (uVar3 & 0xff00) << 8 |
                         uVar3 << 0x18);
          sprintf(local_6e8,"%02X 00 %08X",0x1d,uVar6);
          pbVar8 = pbVar9 + (uVar6 - (long)pauchData);
          pcVar12 = "JMP off_%08X";
LAB_00147943:
          pbVar11 = pbVar9 + 6;
          goto LAB_00147de8;
        }
        break;
      case 0x1e:
        if (pbVar7 < pbVar9 + 6) goto switchD_001473cb_caseD_2e;
        if (*pbVar8 == 0) {
          uVar3 = *(uint *)(pbVar9 + 2);
          uVar6 = (ulong)(uVar3 >> 0x18 | (uVar3 & 0xff0000) >> 8 | (uVar3 & 0xff00) << 8 |
                         uVar3 << 0x18);
          sprintf(local_6e8,"%02X 00 %08X",0x1e,uVar6);
          pbVar8 = pbVar9 + (uVar6 - (long)pauchData);
          pcVar12 = "JSR fn_%08X";
          goto LAB_00147943;
        }
        break;
      case 0x1f:
        if (pbVar7 < pbVar9 + 6) goto switchD_001473cb_caseD_2e;
        if (*pbVar8 == 0) {
          uVar3 = *(uint *)(pbVar9 + 2);
          uVar6 = (ulong)(uVar3 >> 0x18 | (uVar3 & 0xff0000) >> 8 | (uVar3 & 0xff00) << 8 |
                         uVar3 << 0x18);
          sprintf(local_6e8,"%02X 00 %08X",0x1f,uVar6);
          pbVar8 = pbVar9 + (uVar6 - (long)pauchData);
          pcVar12 = "JZ off_%08X";
          goto LAB_00147943;
        }
        break;
      case 0x20:
        pbVar11 = pbVar9 + 2;
        if (pbVar7 < pbVar11) goto switchD_001473cb_caseD_2e;
        if (*pbVar8 == 0) {
          sprintf(local_6e8,"%02X 00",0x20);
          local_638 = CONCAT35(local_638._5_3_,0x4e544552);
          goto LAB_00147be0;
        }
        break;
      case 0x21:
        pbVar11 = pbVar9 + 8;
        if (pbVar7 < pbVar11) goto switchD_001473cb_caseD_2e;
        if (*pbVar8 == 1) {
          pcVar12 = (char *)(ulong)(ushort)(*(ushort *)(pbVar9 + 2) << 8 |
                                           *(ushort *)(pbVar9 + 2) >> 8);
          uVar6 = (ulong)(ushort)(*(ushort *)(pbVar9 + 4) << 8 | *(ushort *)(pbVar9 + 4) >> 8);
          uVar10 = (ulong)(ushort)(*(ushort *)(pbVar9 + 6) << 8 | *(ushort *)(pbVar9 + 6) >> 8);
          sprintf(local_6e8,"%02X 01 %04X %04X %04x",0x21,pcVar12,uVar6,uVar10);
          pcVar14 = "DESTRUCT %04X, %04X, %04X";
          goto LAB_00147e71;
        }
        break;
      case 0x22:
        pcVar14 = "NOT";
switchD_001473cb_caseD_2:
        if (pbVar7 < pbVar9 + 2) goto switchD_001473cb_caseD_2e;
        bVar1 = *pbVar8;
        GetOpText(bVar1,local_668);
        sprintf(local_6e8,"%02X %02X",uVar6,(ulong)bVar1);
        sprintf((char *)&local_638,"%s%s",pcVar14,local_668);
LAB_0014782b:
        pbVar11 = pbVar9 + 2;
        goto LAB_00147be0;
      case 0x23:
        pbVar11 = pbVar9 + 6;
        if (pbVar7 < pbVar11) goto switchD_001473cb_caseD_2e;
        if (*pbVar8 == 3) {
          uVar3 = *(uint *)(pbVar9 + 2);
          pbVar8 = (byte *)(ulong)(uVar3 >> 0x18 | (uVar3 & 0xff0000) >> 8 | (uVar3 & 0xff00) << 8 |
                                  uVar3 << 0x18);
          sprintf(local_6e8,"%02X 03 %08X",0x23,pbVar8);
          pcVar12 = "DECISP %08X";
          goto LAB_00147de8;
        }
        break;
      case 0x24:
        pbVar11 = pbVar9 + 6;
        if (pbVar7 < pbVar11) goto switchD_001473cb_caseD_2e;
        if (*pbVar8 == 3) {
          uVar3 = *(uint *)(pbVar9 + 2);
          pbVar8 = (byte *)(ulong)(uVar3 >> 0x18 | (uVar3 & 0xff0000) >> 8 | (uVar3 & 0xff00) << 8 |
                                  uVar3 << 0x18);
          sprintf(local_6e8,"%02X 03 %08X",0x24,pbVar8);
          pcVar12 = "INCISP %08X";
          goto LAB_00147de8;
        }
        break;
      case 0x25:
        if (pbVar7 < pbVar9 + 6) goto switchD_001473cb_caseD_2e;
        if (*pbVar8 == 0) {
          uVar3 = *(uint *)(pbVar9 + 2);
          uVar6 = (ulong)(uVar3 >> 0x18 | (uVar3 & 0xff0000) >> 8 | (uVar3 & 0xff00) << 8 |
                         uVar3 << 0x18);
          sprintf(local_6e8,"%02X 00 %08X",0x25,uVar6);
          pbVar8 = pbVar9 + (uVar6 - (long)pauchData);
          pcVar12 = "JNZ off_%08X";
          goto LAB_00147943;
        }
        break;
      case 0x26:
        if (pbVar7 < pbVar9 + 8) goto switchD_001473cb_caseD_2e;
        if (*pbVar8 == 1) {
          uVar3 = *(uint *)(pbVar9 + 2);
          uVar10 = (ulong)(uVar3 >> 0x18 | (uVar3 & 0xff0000) >> 8 | (uVar3 & 0xff00) << 8 |
                          uVar3 << 0x18);
          uVar6 = (ulong)(ushort)(*(ushort *)(pbVar9 + 6) << 8 | *(ushort *)(pbVar9 + 6) >> 8);
          sprintf(local_6e8,"%02X 01 %08X %04X",0x26,uVar10,uVar6);
          pcVar12 = "CPDOWNBP %08X, %04X";
          goto LAB_00147abf;
        }
        break;
      case 0x27:
        if (pbVar7 < pbVar9 + 8) goto switchD_001473cb_caseD_2e;
        if (*pbVar8 == 1) {
          uVar3 = *(uint *)(pbVar9 + 2);
          uVar10 = (ulong)(uVar3 >> 0x18 | (uVar3 & 0xff0000) >> 8 | (uVar3 & 0xff00) << 8 |
                          uVar3 << 0x18);
          uVar6 = (ulong)(ushort)(*(ushort *)(pbVar9 + 6) << 8 | *(ushort *)(pbVar9 + 6) >> 8);
          sprintf(local_6e8,"%02X 01 %08X %04X",0x27,uVar10,uVar6);
          pcVar12 = "CPTOPBP %08X, %04X";
          goto LAB_00147abf;
        }
        break;
      case 0x28:
        pbVar11 = pbVar9 + 6;
        if (pbVar7 < pbVar11) goto switchD_001473cb_caseD_2e;
        if (*pbVar8 == 3) {
          uVar3 = *(uint *)(pbVar9 + 2);
          pbVar8 = (byte *)(ulong)(uVar3 >> 0x18 | (uVar3 & 0xff0000) >> 8 | (uVar3 & 0xff00) << 8 |
                                  uVar3 << 0x18);
          sprintf(local_6e8,"%02X 03 %08X",0x28,pbVar8);
          pcVar12 = "DECIBP %08X";
          goto LAB_00147de8;
        }
        break;
      case 0x29:
        pbVar11 = pbVar9 + 6;
        if (pbVar7 < pbVar11) goto switchD_001473cb_caseD_2e;
        if (*pbVar8 == 3) {
          uVar3 = *(uint *)(pbVar9 + 2);
          pbVar8 = (byte *)(ulong)(uVar3 >> 0x18 | (uVar3 & 0xff0000) >> 8 | (uVar3 & 0xff00) << 8 |
                                  uVar3 << 0x18);
          sprintf(local_6e8,"%02X 03 %08X",0x29,pbVar8);
          pcVar12 = "INCIBP %08X";
          goto LAB_00147de8;
        }
        break;
      case 0x2a:
        pbVar11 = pbVar9 + 2;
        if (pbVar7 < pbVar11) goto switchD_001473cb_caseD_2e;
        if (*pbVar8 == 0) {
          sprintf(local_6e8,"%02X 00",0x2a);
          local_638 = CONCAT17(local_638._7_1_,0x504245564153);
          goto LAB_00147be0;
        }
        break;
      case 0x2b:
        pbVar11 = pbVar9 + 2;
        if (pbVar7 < pbVar11) goto switchD_001473cb_caseD_2e;
        if (*pbVar8 == 0) {
          sprintf(local_6e8,"%02X 00",0x2b);
          local_638 = 0x4245524f54534552;
          local_630 = 0x50;
          goto LAB_00147be0;
        }
        break;
      case 0x2c:
        pbVar11 = pbVar9 + 10;
        if (pbVar7 < pbVar11) break;
        pcVar12 = (char *)(ulong)pbVar9[1];
        uVar3 = *(uint *)(pbVar9 + 2);
        uVar2 = *(uint *)(pbVar9 + 6);
        uVar6 = (ulong)(uVar3 >> 0x18 | (uVar3 & 0xff0000) >> 8 | (uVar3 & 0xff00) << 8 |
                       uVar3 << 0x18);
        uVar10 = (ulong)(uVar2 >> 0x18 | (uVar2 & 0xff0000) >> 8 | (uVar2 & 0xff00) << 8 |
                        uVar2 << 0x18);
        sprintf(local_6e8,"%02X %02X %08X %08X",0x2c,pcVar12,uVar6,uVar10);
        pcVar14 = "STORE_STATE %02X, %08X, %08X";
LAB_00147e71:
        sprintf((char *)&local_638,pcVar14,pcVar12,uVar6,uVar10);
        goto LAB_00147be0;
      case 0x2d:
        pbVar11 = pbVar9 + 2;
        if (pbVar7 < pbVar11) goto switchD_001473cb_caseD_2e;
        if (*pbVar8 == 0) {
          sprintf(local_6e8,"%02X 00",0x2d);
          local_638 = CONCAT44(local_638._4_4_,0x504f4e);
          goto LAB_00147be0;
        }
        break;
      case 0x2e:
      case 0x2f:
      case 0x30:
      case 0x31:
      case 0x32:
      case 0x33:
      case 0x34:
      case 0x35:
      case 0x36:
      case 0x37:
      case 0x38:
      case 0x39:
      case 0x3a:
      case 0x3b:
      case 0x3c:
      case 0x3d:
      case 0x3e:
      case 0x3f:
      case 0x40:
      case 0x41:
        goto switchD_001473cb_caseD_2e;
      case 0x42:
        pbVar11 = pbVar9 + 5;
        if (pbVar11 <= pbVar7) {
          uVar3 = *(uint *)(pbVar9 + 1);
          pbVar8 = (byte *)(ulong)(uVar3 >> 0x18 | (uVar3 & 0xff0000) >> 8 | (uVar3 & 0xff00) << 8 |
                                  uVar3 << 0x18);
          sprintf(local_6e8,"%02X %08X",0x42,pbVar8);
          pcVar12 = "T %08X";
LAB_00147de8:
          sprintf((char *)&local_638,pcVar12,pbVar8);
          goto LAB_00147be0;
        }
      }
      pbVar11 = pbVar8;
      sprintf(local_6e8,"%02X",uVar6);
      local_638 = CONCAT53(local_638._3_5_,0x3f3f);
LAB_00147be0:
      sprintf(local_438,"%08X %-24s %s",(long)pbVar9 - (long)pauchData,local_6e8,&local_638);
      (*local_640->_vptr_CNwnStream[6])(local_640,local_438,1);
      pbVar9 = pbVar11;
    } while (pbVar11 < pbVar7);
  }
  return;
}

Assistant:

void NscScriptDecompile (CNwnStream &sStream, 
	unsigned char *pauchData, unsigned long ulSize, NscCompiler *pCompiler)
{

	//
	// Loop through the data
	//

	unsigned char *pStart = pauchData;
	unsigned char *pEnd = &pauchData [ulSize];
	unsigned char *pData = pStart;
	pData += 8;
	while (pData < pEnd)
	{
		char szByteText [128];
		char szOpText [512];
		char szOpType [32];
		char *pszOpRoot;

		//
		// Switch based on the next opcode
		//

		unsigned char *pOp = pData;
		unsigned char cOp = *pData++;
		switch (cOp)
		{

			case NscCode_CPDOWNSP:
				{
					if (&pData [7] > pEnd || pData [0] != 1)
						goto invalid_op;
					unsigned long ul1, ul2;
					pData = GetUINT32 (pData + 1, &ul1);
					pData = GetUINT16 (pData, &ul2);
					sprintf (szByteText, "%02X 01 %08X %04X", cOp, ul1, ul2);
					sprintf (szOpText, "CPDOWNSP %08X, %04X", ul1, ul2);
				}
				break;

			case NscCode_RSADD:
				pszOpRoot = "RSADD";
do_simple_operator:;
				{
					if (&pData [1] > pEnd)
						goto invalid_op;
					unsigned char cOpType = *pData++;
					GetOpText (cOpType, szOpType);
					sprintf (szByteText, "%02X %02X", cOp, cOpType);
					sprintf (szOpText, "%s%s", pszOpRoot, szOpType);
				}
				break;

			case NscCode_CPTOPSP:
				{
					if (&pData [7] > pEnd || pData [0] != 1)
						goto invalid_op;
					unsigned long ul1, ul2;
					pData = GetUINT32 (pData + 1, &ul1);
					pData = GetUINT16 (pData, &ul2);
					sprintf (szByteText, "%02X 01 %08X %04X", cOp, ul1, ul2);
					sprintf (szOpText, "CPTOPSP %08X, %04X", ul1, ul2);
				}
				break;

			case NscCode_CONST:
				{
					if (&pData [1] > pEnd)
						goto invalid_op;
					unsigned char cOpType = *pData;
					GetOpText (cOpType, szOpType);
					switch (cOpType)
					{
						case 3:
						case 6:
							{
								if (&pData [5] > pEnd)
									goto invalid_op;
								unsigned long ul;
								pData = GetUINT32 (pData + 1, &ul);
								sprintf (szByteText, "%02X %02X %08X", cOp, cOpType, ul);
								sprintf (szOpText, "CONST%s %08X", szOpType, ul);
							}
							break;

						case 4:
							{
								if (&pData [5] > pEnd)
									goto invalid_op;
								union
								{
									unsigned long ul;
									float f;
								} val;
								pData = GetFLOAT (pData + 1, &val .f);
								sprintf (szByteText, "%02X %02X %08X", cOp, cOpType, val .ul);
								sprintf (szOpText, "CONST%s %f", szOpType, val .f);
							}
							break;

						case 5:
							{
								if (&pData [3] > pEnd)
									goto invalid_op;
								unsigned long ul;
								GetUINT16 (pData + 1, &ul);
								if (&pData [3 + ul] > pEnd)
									goto invalid_op;
								pData += 3;
								char szValue [129];
								unsigned long ulCopy = ul > 128 ? 128 : ul;
								memmove (szValue, pData, ulCopy);
								szValue [ulCopy] = 0;
								sprintf (szByteText, "%02X %02X %04X str", cOp, cOpType, ul);
								snprintf (szOpText, _countof (szOpText), 
									"CONST%s \"%s\"", szOpType, szValue);
								pData += ul;
							}
							break;

						default:
							goto invalid_op;
					}
				}
				break;

			case NscCode_ACTION:
				{
					if (&pData [4] > pEnd || pData [0] != 0)
						goto invalid_op;
					unsigned long ul1, ul2;
					pData = GetUINT16 (pData + 1, &ul1);
					ul2 = *pData++;
					const char *pszName = NscGetActionName ((int) ul1, pCompiler);
					sprintf (szByteText, "%02X 00 %04X %02X", cOp, ul1, ul2);
					sprintf (szOpText, "ACTION %s(%04X), %02X", pszName, ul1, ul2);
				}
				break;

			case NscCode_LOGAND:
				pszOpRoot = "LOGAND";
do_binary_operator:;
				{
					if (&pData [1] > pEnd)
						goto invalid_op;
					unsigned char cOpType = *pData++;
					GetOpText (cOpType, szOpType);
					if (cOpType == 0x24)
					{
						if (&pData [2] > pEnd)
							goto invalid_op;
						unsigned long ul1;
						pData = GetUINT16 (pData, &ul1);
						sprintf (szByteText, "%02X %02X %04X", cOp, cOpType, ul1);
						sprintf (szOpText, "%s%s %04X", pszOpRoot, szOpType, ul1);
					}
					else
					{
						sprintf (szByteText, "%02X %02X", cOp, cOpType);
						sprintf (szOpText, "%s%s", pszOpRoot, szOpType);
					}
				}
				break;

			case NscCode_LOGOR:
				pszOpRoot = "LOGOR";
				goto do_binary_operator;

			case NscCode_INCOR:
				pszOpRoot = "INCOR";
				goto do_binary_operator;

			case NscCode_EXCOR:
				pszOpRoot = "EXCOR";
				goto do_binary_operator;

			case NscCode_BOOLAND:
				pszOpRoot = "BOOLAND";
				goto do_binary_operator;

			case NscCode_EQUAL:
				pszOpRoot = "EQUAL";
				goto do_binary_operator;

			case NscCode_NEQUAL:
				pszOpRoot = "NEQUAL";
				goto do_binary_operator;

			case NscCode_GEQ:
				pszOpRoot = "GEQ";
				goto do_binary_operator;

			case NscCode_GT:
				pszOpRoot = "GT";
				goto do_binary_operator;

			case NscCode_LT:
				pszOpRoot = "LT";
				goto do_binary_operator;

			case NscCode_LEQ:
				pszOpRoot = "LEQ";
				goto do_binary_operator;

			case NscCode_SHLEFT:
				pszOpRoot = "SHLEFT";
				goto do_binary_operator;

			case NscCode_SHRIGHT:
				pszOpRoot = "SHRIGHT";
				goto do_binary_operator;

			case NscCode_USHRIGHT:
				pszOpRoot = "USHRIGHT";
				goto do_binary_operator;

			case NscCode_ADD:
				pszOpRoot = "ADD";
				goto do_binary_operator;

			case NscCode_SUB:
				pszOpRoot = "SUB";
				goto do_binary_operator;

			case NscCode_MUL:
				pszOpRoot = "MUL";
				goto do_binary_operator;

			case NscCode_DIV:
				pszOpRoot = "DIV";
				goto do_binary_operator;

			case NscCode_MOD:
				pszOpRoot = "MOD";
				goto do_binary_operator;

			case NscCode_NEG:
				pszOpRoot = "NEG";
				goto do_simple_operator;

			case NscCode_COMP:
				pszOpRoot = "COMP";
				goto do_simple_operator;

			case NscCode_MOVSP:
				{
					if (&pData [5] > pEnd || pData [0] != 0)
						goto invalid_op;
					unsigned long ul1;
					pData = GetUINT32 (pData + 1, &ul1);
					sprintf (szByteText, "%02X 00 %08X", cOp, ul1);
					sprintf (szOpText, "MOVSP %08X", ul1);
				}
				break;

			case NscCode_STORE_STATEALL:
				{
					if (&pData [1] > pEnd)
						goto invalid_op;
					unsigned long ul = *pData++;
					sprintf (szByteText, "%02X %02X", cOp, ul);
					sprintf (szOpText, "SAVE_STATEALL %02x", ul);
				}
				break;

			case NscCode_JMP:
				{
					if (&pData [5] > pEnd || pData [0] != 0)
						goto invalid_op;
					unsigned long ul1;
					pData = GetUINT32 (pData + 1, &ul1);
					sprintf (szByteText, "%02X 00 %08X", cOp, ul1);
					sprintf (szOpText, "JMP off_%08X", (pOp - pStart) + ul1);
				}
				break;

			case NscCode_JSR:
				{
					if (&pData [5] > pEnd || pData [0] != 0)
						goto invalid_op;
					unsigned long ul1;
					pData = GetUINT32 (pData + 1, &ul1);
					sprintf (szByteText, "%02X 00 %08X", cOp, ul1);
					sprintf (szOpText, "JSR fn_%08X", (pOp - pStart) + ul1);
				}
				break;

			case NscCode_JZ:
				{
					if (&pData [5] > pEnd || pData [0] != 0)
						goto invalid_op;
					unsigned long ul1;
					pData = GetUINT32 (pData + 1, &ul1);
					sprintf (szByteText, "%02X 00 %08X", cOp, ul1);
					sprintf (szOpText, "JZ off_%08X", (pOp - pStart) + ul1);
				}
				break;

			case NscCode_RETN:
				{
					if (&pData [1] > pEnd || pData [0] != 0)
						goto invalid_op;
					pData++;
					sprintf (szByteText, "%02X 00", cOp);
					sprintf (szOpText, "RETN");
				}
				break;

			case NscCode_DESTRUCT:
				{
					if (&pData [7] > pEnd || pData [0] != 1)
						goto invalid_op;
					unsigned long ul1, ul2, ul3;
					pData = GetUINT16 (pData + 1, &ul1);
					pData = GetUINT16 (pData, &ul2);
					pData = GetUINT16 (pData, &ul3);
					sprintf (szByteText, "%02X 01 %04X %04X %04x", cOp, ul1, ul2, ul3);
					sprintf (szOpText, "DESTRUCT %04X, %04X, %04X", ul1, ul2, ul3);
					// First parameter, number of bytes to destroy
					// Second parameter, offset of element not to destroy
					// Third parameter, number of bytes no to destroy
				}
				break;

			case NscCode_NOT:
				pszOpRoot = "NOT";
				goto do_simple_operator;

			case NscCode_DECISP:
				{
					if (&pData [5] > pEnd || pData [0] != 3)
						goto invalid_op;
					unsigned long ul1;
					pData = GetUINT32 (pData + 1, &ul1);
					sprintf (szByteText, "%02X 03 %08X", cOp, ul1);
					sprintf (szOpText, "DECISP %08X", ul1);
				}
				break;

			case NscCode_INCISP:
				{
					if (&pData [5] > pEnd || pData [0] != 3)
						goto invalid_op;
					unsigned long ul1;
					pData = GetUINT32 (pData + 1, &ul1);
					sprintf (szByteText, "%02X 03 %08X", cOp, ul1);
					sprintf (szOpText, "INCISP %08X", ul1);
				}
				break;

			case NscCode_JNZ:
				{
					if (&pData [5] > pEnd || pData [0] != 0)
						goto invalid_op;
					unsigned long ul1;
					pData = GetUINT32 (pData + 1, &ul1);
					sprintf (szByteText, "%02X 00 %08X", cOp, ul1);
					sprintf (szOpText, "JNZ off_%08X", (pOp - pStart) + ul1);
				}
				break;

			case NscCode_CPDOWNBP:
				{
					if (&pData [7] > pEnd || pData [0] != 1)
						goto invalid_op;
					unsigned long ul1, ul2;
					pData = GetUINT32 (pData + 1, &ul1);
					pData = GetUINT16 (pData, &ul2);
					sprintf (szByteText, "%02X 01 %08X %04X", cOp, ul1, ul2);
					sprintf (szOpText, "CPDOWNBP %08X, %04X", ul1, ul2);
				}
				break;

			case NscCode_CPTOPBP:
				{
					if (&pData [7] > pEnd || pData [0] != 1)
						goto invalid_op;
					unsigned long ul1, ul2;
					pData = GetUINT32 (pData + 1, &ul1);
					pData = GetUINT16 (pData, &ul2);
					sprintf (szByteText, "%02X 01 %08X %04X", cOp, ul1, ul2);
					sprintf (szOpText, "CPTOPBP %08X, %04X", ul1, ul2);
				}
				break;

			case NscCode_DECIBP:
				{
					if (&pData [5] > pEnd || pData [0] != 3)
						goto invalid_op;
					unsigned long ul1;
					pData = GetUINT32 (pData + 1, &ul1);
					sprintf (szByteText, "%02X 03 %08X", cOp, ul1);
					sprintf (szOpText, "DECIBP %08X", ul1);
				}
				break;

			case NscCode_INCIBP:
				{
					if (&pData [5] > pEnd || pData [0] != 3)
						goto invalid_op;
					unsigned long ul1;
					pData = GetUINT32 (pData + 1, &ul1);
					sprintf (szByteText, "%02X 03 %08X", cOp, ul1);
					sprintf (szOpText, "INCIBP %08X", ul1);
				}
				break;

			case NscCode_SAVEBP:
				{
					if (&pData [1] > pEnd || pData [0] != 0)
						goto invalid_op;
					pData++;
					sprintf (szByteText, "%02X 00", cOp);
					sprintf (szOpText, "SAVEBP");
				}
				break;

			case NscCode_RESTOREBP:
				{
					if (&pData [1] > pEnd || pData [0] != 0)
						goto invalid_op;
					pData++;
					sprintf (szByteText, "%02X 00", cOp);
					sprintf (szOpText, "RESTOREBP");
				}
				break;

			case NscCode_STORE_STATE:
				{
					if (&pData [9] > pEnd)
						goto invalid_op;
					unsigned long ul1, ul2, ul3;
					ul3 = *pData++;
					pData = GetUINT32 (pData, &ul1);
					pData = GetUINT32 (pData, &ul2);
					sprintf (szByteText, "%02X %02X %08X %08X", cOp, ul3, ul1, ul2);
					sprintf (szOpText, "STORE_STATE %02X, %08X, %08X", ul3, ul1, ul2);
				    // First value is BP stack size to save
					// second value is SP stack size to save
				}
				break;

			case NscCode_NOP:
				{
					if (&pData [1] > pEnd || pData [0] != 0)
						goto invalid_op;
					pData++;
					sprintf (szByteText, "%02X 00", cOp);
					sprintf (szOpText, "NOP");
				}
				break;

			case NscCode_Size:
				{
					if (&pData [4] > pEnd)
						goto invalid_op;
					unsigned long ul;
					pData = GetUINT32 (pData, &ul);
					sprintf (szByteText, "%02X %08X", cOp, ul);
					sprintf (szOpText, "T %08X", ul);
				}
				break;

			default:
invalid_op:;
				sprintf (szByteText, "%02X", cOp);
				sprintf (szOpText, "??");
				//if (g_fpDebug)
				//	fprintf (g_fpDebug, "Unknown opcode %02x\r\n", cOp);
				break;
		}

		//
		// Format the final line
		//

		char szText [1024];
		sprintf (szText, "%08X %-24s %s", pOp - pStart, szByteText, szOpText);
		sStream .WriteLine (szText);
	}
}